

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

size_t __thiscall rtosc::Port::MetaContainer::length(MetaContainer *this)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  char cVar5;
  char cVar6;
  
  pcVar1 = this->str_ptr;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    sVar4 = 0;
  }
  else {
    sVar4 = 2;
    cVar3 = *pcVar1;
    cVar5 = '\0';
    while (cVar6 = cVar3, cVar5 != '\0' || cVar6 != '\0') {
      lVar2 = sVar4 - 1;
      sVar4 = sVar4 + 1;
      cVar5 = cVar6;
      cVar3 = pcVar1[lVar2];
    }
  }
  return sVar4;
}

Assistant:

size_t Port::MetaContainer::length(void) const
{
        if(!str_ptr || !*str_ptr)
            return 0;
        char prev = 0;
        const char *itr = str_ptr;
        while(prev || *itr)
            prev = *itr++;
        return 2+(itr-str_ptr);
}